

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_0::getLevelCount(ImageInfo *info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (info->m_target == 0x8d41) {
    return 1;
  }
  uVar2 = (info->m_size).m_data[0];
  uVar1 = (info->m_size).m_data[1];
  if (info->m_target == 0x8c1a) {
    if ((int)uVar1 < (int)uVar2) {
      uVar1 = uVar2;
    }
    if (uVar1 == 0) {
      uVar2 = 0x20;
    }
    else {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    return 0x1f - ((uVar2 - 1) + (uint)((uVar1 - 1 & uVar1) == 0));
  }
  uVar3 = (info->m_size).m_data[2];
  if ((int)uVar3 < (int)uVar1) {
    uVar3 = uVar1;
  }
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (uVar3 == 0) {
    uVar2 = 0x20;
  }
  else {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  return 0x1f - ((uVar2 - 1) + (uint)((uVar3 - 1 & uVar3) == 0));
}

Assistant:

deUint32		getTarget		(void) const { return m_target; }